

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O0

bool __thiscall cmGlobalGenerator::MatchesGeneratorName(cmGlobalGenerator *this,string *name)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *name_local;
  cmGlobalGenerator *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  (*this->_vptr_cmGlobalGenerator[3])(&local_38);
  _Var1 = std::operator==(&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  return _Var1;
}

Assistant:

virtual bool MatchesGeneratorName(const std::string& name) const
  {
    return this->GetName() == name;
  }